

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O0

ostream * glu::detail::operator<<(ostream *str,BooleanPointerFmt *fmt)

{
  BooleanPointerFmt *stream;
  Enum<int,_1UL> EVar1;
  Enum<int,_1UL> local_38;
  uint local_24;
  BooleanPointerFmt *pBStack_20;
  deUint32 ndx;
  BooleanPointerFmt *fmt_local;
  ostream *str_local;
  
  pBStack_20 = fmt;
  fmt_local = (BooleanPointerFmt *)str;
  if (fmt->value == (deUint8 *)0x0) {
    str_local = std::operator<<(str,"(null)");
  }
  else {
    std::operator<<(str,"{ ");
    for (local_24 = 0; local_24 < pBStack_20->size; local_24 = local_24 + 1) {
      if (local_24 != 0) {
        std::operator<<((ostream *)fmt_local,", ");
      }
      stream = fmt_local;
      EVar1 = getBooleanStr(pBStack_20->value[local_24]);
      local_38.m_getName = EVar1.m_getName;
      local_38.m_value = EVar1.m_value;
      tcu::Format::operator<<((ostream *)stream,&local_38);
    }
    std::operator<<((ostream *)fmt_local," }");
    str_local = (ostream *)fmt_local;
  }
  return str_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const BooleanPointerFmt& fmt)
{
	if (fmt.value)
	{
		str << "{ ";
		for (deUint32 ndx = 0; ndx < fmt.size; ndx++)
		{
			if (ndx != 0)
				str << ", ";
			str << getBooleanStr(fmt.value[ndx]);
		}
		str << " }";
		return str;
	}
	else
		return str << "(null)";
}